

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void InputTextReconcileUndoStateAfterUserCallback
               (ImGuiInputTextState *state,char *new_buf_a,int new_length_a)

{
  long lVar1;
  ImGuiContext *pIVar2;
  ImWchar IVar3;
  int iVar4;
  int iVar5;
  ImWchar *pIVar6;
  long in_RDI;
  int i;
  ImWchar *p;
  int delete_len;
  int insert_len;
  int new_last_diff;
  int old_last_diff;
  int first_diff;
  int shorter_length;
  ImWchar *new_buf;
  int new_length;
  int old_length;
  ImWchar *old_buf;
  ImGuiContext *g;
  int in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint insert_len_00;
  int in_stack_ffffffffffffffa4;
  StbUndoState *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar7;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffc4;
  char *pcVar9;
  
  pIVar2 = GImGui;
  lVar1 = *(long *)(in_RDI + 0x18);
  iVar7 = *(int *)(in_RDI + 4);
  iVar4 = ImTextCountCharsFromUtf8
                    ((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (char *)in_stack_ffffffffffffffa8);
  ImVector<char>::reserve_discard
            ((ImVector<char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c);
  pcVar9 = (pIVar2->TempBuffer).Data;
  ImTextStrFromUtf8((ImWchar *)CONCAT44(iVar7,iVar4),(int)((ulong)pcVar9 >> 0x20),
                    (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar5 = ImMin<int>(iVar7,iVar4);
  iVar8 = 0;
  while ((iVar8 < iVar5 &&
         (*(short *)(lVar1 + (long)iVar8 * 2) == *(short *)(pcVar9 + (long)iVar8 * 2)))) {
    iVar8 = iVar8 + 1;
  }
  if ((iVar8 != iVar7) || (iVar8 != iVar4)) {
    do {
      iVar7 = iVar7 + -1;
      iVar4 = iVar4 + -1;
      insert_len_00 = in_stack_ffffffffffffffa0 & 0xffffff;
      if (iVar8 <= iVar7) {
        insert_len_00 = CONCAT13(iVar8 <= iVar4,(int3)in_stack_ffffffffffffffa0);
      }
    } while (((char)(insert_len_00 >> 0x18) != '\0') &&
            (in_stack_ffffffffffffffa0 = insert_len_00,
            *(short *)(lVar1 + (long)iVar7 * 2) == *(short *)(pcVar9 + (long)iVar4 * 2)));
    iVar7 = (iVar7 - iVar8) + 1;
    if (((0 < (iVar4 - iVar8) + 1) || (0 < iVar7)) &&
       (pIVar6 = ImStb::stb_text_createundo
                           (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,insert_len_00,
                            in_stack_ffffffffffffff9c), pIVar6 != (ImWchar *)0x0)) {
      for (iVar4 = 0; iVar4 < iVar7; iVar4 = iVar4 + 1) {
        IVar3 = ImStb::STB_TEXTEDIT_GETCHAR
                          ((ImGuiInputTextState *)CONCAT44(iVar4,insert_len_00),
                           in_stack_ffffffffffffff9c);
        pIVar6[iVar4] = IVar3;
      }
    }
  }
  return;
}

Assistant:

static void InputTextReconcileUndoStateAfterUserCallback(ImGuiInputTextState* state, const char* new_buf_a, int new_length_a)
{
    ImGuiContext& g = *GImGui;
    const ImWchar* old_buf = state->TextW.Data;
    const int old_length = state->CurLenW;
    const int new_length = ImTextCountCharsFromUtf8(new_buf_a, new_buf_a + new_length_a);
    g.TempBuffer.reserve_discard((new_length + 1) * sizeof(ImWchar));
    ImWchar* new_buf = (ImWchar*)(void*)g.TempBuffer.Data;
    ImTextStrFromUtf8(new_buf, new_length + 1, new_buf_a, new_buf_a + new_length_a);

    const int shorter_length = ImMin(old_length, new_length);
    int first_diff;
    for (first_diff = 0; first_diff < shorter_length; first_diff++)
        if (old_buf[first_diff] != new_buf[first_diff])
            break;
    if (first_diff == old_length && first_diff == new_length)
        return;

    int old_last_diff = old_length - 1;
    int new_last_diff = new_length - 1;
    for (; old_last_diff >= first_diff && new_last_diff >= first_diff; old_last_diff--, new_last_diff--)
        if (old_buf[old_last_diff] != new_buf[new_last_diff])
            break;

    const int insert_len = new_last_diff - first_diff + 1;
    const int delete_len = old_last_diff - first_diff + 1;
    if (insert_len > 0 || delete_len > 0)
        if (STB_TEXTEDIT_CHARTYPE* p = stb_text_createundo(&state->Stb.undostate, first_diff, delete_len, insert_len))
            for (int i = 0; i < delete_len; i++)
                p[i] = ImStb::STB_TEXTEDIT_GETCHAR(state, first_diff + i);
}